

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O1

char * ScanInt(FILE *out,int *a)

{
  int iVar1;
  char *format;
  
  iVar1 = __isoc99_fscanf(out,"%d",a);
  if (iVar1 < 0) {
    format = "output too short -- ";
  }
  else {
    if (iVar1 != 0) {
      return "PASSED";
    }
    format = "bad output format -- ";
  }
  PrintWithoutBuffering(format);
  return "FAILED";
}

Assistant:

const char* ScanInt(FILE* out, int* a) {
    int status = fscanf(out, "%d", a);
    if (status < 0) {
        PrintWithoutBuffering("output too short -- ");
        return Fail;
    } else if (status < 1) {
        PrintWithoutBuffering("bad output format -- ");
        return Fail;
    }
    return Pass;
}